

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O0

void __thiscall ReconnectingHub::connectToTarget(ReconnectingHub *this)

{
  DashelException *e;
  ReconnectingHub *this_local;
  
  Dashel::Hub::connect((string *)this);
  return;
}

Assistant:

void connectToTarget()
	{
		try
		{
			connect(target);
		}
		catch (const DashelException& e)
		{
			cout << endl
				 << "Failed connecting to " << target << " : " << e.what() << endl;
		}
	}